

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_delete(ImGuiInputTextState *str,STB_TexteditState *state,int where,int len)

{
  int len_local;
  int where_local;
  STB_TexteditState *state_local;
  ImGuiInputTextState *str_local;
  
  stb_text_makeundo_delete(str,state,where,len);
  STB_TEXTEDIT_DELETECHARS(str,where,len);
  state->has_preferred_x = '\0';
  return;
}

Assistant:

static void stb_textedit_delete(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int len)
{
   stb_text_makeundo_delete(str, state, where, len);
   STB_TEXTEDIT_DELETECHARS(str, where, len);
   state->has_preferred_x = 0;
}